

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O1

void __thiscall
VPLGrammar::Parser::AdditiveExpressionNode::~AdditiveExpressionNode(AdditiveExpressionNode *this)

{
  ASTNodeBasic::~ASTNodeBasic(&this->super_ASTNodeBasic);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                children_[0]->BuildProgram(scope, out);
                for (size_t i = 2; i < children_.size(); i += 2) {
                    children_[i]->BuildProgram(scope, out);
                    out << "    ";
                    switch(children_[i - 1]->GetType()) {
                        case kPlusType:
                            out << "    add\n";
                            break;
                        case kMinusType:
                            out << "    sub\n";
                            break;
                    }
                    out << '\n';
                    scope->Pop();
                }
            }